

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# proto_handler.cpp
# Opt level: O2

void __thiscall ProtoHandler::OnDispatch(ProtoHandler *this,json *document)

{
  MessageCMD MVar1;
  reference pvVar2;
  InitParams params;
  InitParams local_a0;
  basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
  local_60;
  basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
  local_50;
  basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
  local_40;
  basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
  local_30;
  basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
  local_20;
  
  pvVar2 = nlohmann::
           basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>
           ::operator[]<char_const>
                     ((basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>
                       *)document,"cmd");
  if ((byte)(pvVar2->m_type - number_integer) < 2) {
    pvVar2 = nlohmann::
             basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>
             ::operator[]<char_const>
                       ((basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>
                         *)document,"cmd");
    MVar1 = nlohmann::
            basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
            ::get_impl<MessageCMD,_0>(pvVar2);
    switch(MVar1) {
    case InitReq:
      local_a0.emmyHelper._M_dataplus._M_p = (pointer)&local_a0.emmyHelper.field_2;
      local_a0.super_JsonProtocol._vptr_JsonProtocol = (_func_int **)&PTR__InitParams_00193e50;
      local_a0.emmyHelper._M_string_length = 0;
      local_a0.emmyHelper.field_2._M_allocated_capacity =
           local_a0.emmyHelper.field_2._M_allocated_capacity & 0xffffffffffffff00;
      local_a0.ext.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      local_a0.ext.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
      local_a0.ext.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      nlohmann::
      basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
      ::basic_json(&local_20,document);
      InitParams::Deserialize(&local_a0,&local_20);
      nlohmann::
      basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
      ::~basic_json(&local_20);
      OnInitReq(this,&local_a0);
      InitParams::~InitParams(&local_a0);
      break;
    case ReadyReq:
      OnReadyReq(this);
      return;
    case AddBreakPointReq:
      local_a0.super_JsonProtocol._vptr_JsonProtocol =
           (_func_int **)&PTR__AddBreakpointParams_00193ee0;
      local_a0.emmyHelper._M_dataplus._M_p =
           local_a0.emmyHelper._M_dataplus._M_p & 0xffffffffffffff00;
      local_a0.emmyHelper._M_string_length = 0;
      local_a0.emmyHelper.field_2._M_allocated_capacity = 0;
      local_a0.emmyHelper.field_2._8_8_ = 0;
      nlohmann::
      basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
      ::basic_json(&local_30,document);
      AddBreakpointParams::Deserialize((AddBreakpointParams *)&local_a0,&local_30);
      nlohmann::
      basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
      ::~basic_json(&local_30);
      OnAddBreakPointReq(this,(AddBreakpointParams *)&local_a0);
      AddBreakpointParams::~AddBreakpointParams((AddBreakpointParams *)&local_a0);
      break;
    case RemoveBreakPointReq:
      local_a0.super_JsonProtocol._vptr_JsonProtocol =
           (_func_int **)&PTR__RemoveBreakpointParams_00193f28;
      local_a0.emmyHelper._M_dataplus._M_p = (pointer)0x0;
      local_a0.emmyHelper._M_string_length = 0;
      local_a0.emmyHelper.field_2._M_allocated_capacity = 0;
      nlohmann::
      basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
      ::basic_json(&local_40,document);
      RemoveBreakpointParams::Deserialize((RemoveBreakpointParams *)&local_a0,&local_40);
      nlohmann::
      basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
      ::~basic_json(&local_40);
      OnRemoveBreakPointReq(this,(RemoveBreakpointParams *)&local_a0);
      RemoveBreakpointParams::~RemoveBreakpointParams((RemoveBreakpointParams *)&local_a0);
      break;
    case ActionReq:
      local_a0.super_JsonProtocol._vptr_JsonProtocol = (_func_int **)&PTR__JsonProtocol_00193f70;
      local_a0.emmyHelper._M_dataplus._M_p._0_4_ = 0xffffffff;
      nlohmann::
      basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
      ::basic_json(&local_50,document);
      ActionParams::Deserialize((ActionParams *)&local_a0,&local_50);
      nlohmann::
      basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
      ::~basic_json(&local_50);
      OnActionReq(this,(ActionParams *)&local_a0);
      JsonProtocol::~JsonProtocol(&local_a0.super_JsonProtocol);
      break;
    case EvalReq:
      local_a0.super_JsonProtocol._vptr_JsonProtocol = (_func_int **)&PTR__EvalParams_00194000;
      local_a0.emmyHelper._M_dataplus._M_p = (pointer)0x0;
      local_a0.emmyHelper._M_string_length = 0;
      nlohmann::
      basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
      ::basic_json(&local_60,document);
      EvalParams::Deserialize((EvalParams *)&local_a0,&local_60);
      nlohmann::
      basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
      ::~basic_json(&local_60);
      OnEvalReq(this,(EvalParams *)&local_a0);
      EvalParams::~EvalParams((EvalParams *)&local_a0);
    }
  }
  return;
}

Assistant:

void ProtoHandler::OnDispatch(nlohmann::json document) {
	if (document["cmd"].is_number_integer()) {
		switch (document["cmd"].get<MessageCMD>()) {
			case MessageCMD::InitReq: {
				InitParams params;
				params.Deserialize(document);
				OnInitReq(params);
				break;
			}
			case MessageCMD::ReadyReq: {
				OnReadyReq();
				break;
			}
			case MessageCMD::AddBreakPointReq: {
				AddBreakpointParams params;
				params.Deserialize(document);
				OnAddBreakPointReq(params);
				break;
			}
			case MessageCMD::RemoveBreakPointReq: {
				RemoveBreakpointParams params;
				params.Deserialize(document);
				OnRemoveBreakPointReq(params);
				break;
			}
			case MessageCMD::ActionReq: {
				ActionParams params;
				params.Deserialize(document);
				OnActionReq(params);
				break;
			}
			case MessageCMD::EvalReq: {
				EvalParams params;
				params.Deserialize(document);
				OnEvalReq(params);
				break;
			}
			default:
				break;
		}
	}
}